

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O3

void HRSS_poly3_mul(poly3 *out,poly3 *x,poly3 *y)

{
  byte *pbVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  poly3_span y_span;
  poly3_span x_span;
  poly3_span scratch_span;
  poly3_span prod_span;
  crypto_word_t prod_a [22];
  crypto_word_t prod_s [22];
  crypto_word_t scratch_a [24];
  crypto_word_t scratch_s [24];
  poly3_span local_338;
  poly3_span local_328;
  poly3_span local_318;
  poly3_span local_308;
  crypto_word_t local_2f8 [10];
  ulong local_2a8;
  ulong auStack_2a0 [11];
  crypto_word_t local_248 [10];
  ulong local_1f8;
  ulong auStack_1f0 [11];
  crypto_word_t local_198 [24];
  crypto_word_t local_d8 [24];
  
  local_308.s = local_248;
  local_308.a = local_2f8;
  local_318.s = local_d8;
  local_318.a = local_198;
  local_328.a = (x->a).v;
  local_338.a = (y->a).v;
  local_338.s = (crypto_word_t *)y;
  local_328.s = (crypto_word_t *)x;
  poly3_mul_aux(&local_308,&local_318,&local_328,&local_338,0xb);
  lVar3 = 0;
  do {
    uVar4 = auStack_1f0[lVar3];
    uVar7 = local_1f8 >> 0x3d | uVar4 << 3;
    uVar6 = local_2f8[lVar3];
    uVar2 = auStack_2a0[lVar3];
    uVar5 = local_2a8 >> 0x3d | uVar2 << 3;
    uVar8 = local_248[lVar3] ^ uVar5;
    (out->s).v[lVar3] = (uVar6 ^ uVar7) & uVar8;
    (out->a).v[lVar3] = uVar8 ^ uVar7 | uVar5 ^ uVar6;
    lVar3 = lVar3 + 1;
    local_2a8 = uVar2;
    local_1f8 = uVar4;
  } while (lVar3 != 0xb);
  uVar4 = (long)((out->s).v[10] << 3) >> 0x3f;
  uVar6 = (long)((out->a).v[10] << 3) >> 0x3f;
  lVar3 = -0x58;
  do {
    uVar2 = *(ulong *)((long)(out->a).v + lVar3);
    uVar5 = *(ulong *)((long)out[1].s.v + lVar3) ^ uVar6;
    *(ulong *)((long)(out->a).v + lVar3) = (uVar5 ^ uVar4) & (uVar2 ^ uVar6);
    *(ulong *)((long)out[1].s.v + lVar3) = uVar2 ^ uVar4 | uVar5;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0);
  pbVar1 = (byte *)((long)(out->s).v + 0x57);
  *pbVar1 = *pbVar1 & 0x1f;
  pbVar1 = (byte *)((long)(out->a).v + 0x57);
  *pbVar1 = *pbVar1 & 0x1f;
  return;
}

Assistant:

void HRSS_poly3_mul(struct poly3 *out, const struct poly3 *x,
                    const struct poly3 *y) {
  crypto_word_t prod_s[WORDS_PER_POLY * 2];
  crypto_word_t prod_a[WORDS_PER_POLY * 2];
  crypto_word_t scratch_s[WORDS_PER_POLY * 2 + 2];
  crypto_word_t scratch_a[WORDS_PER_POLY * 2 + 2];
  const struct poly3_span prod_span = {prod_s, prod_a};
  const struct poly3_span scratch_span = {scratch_s, scratch_a};
  const struct poly3_span x_span = {(crypto_word_t *)x->s.v,
                                    (crypto_word_t *)x->a.v};
  const struct poly3_span y_span = {(crypto_word_t *)y->s.v,
                                    (crypto_word_t *)y->a.v};

  poly3_mul_aux(&prod_span, &scratch_span, &x_span, &y_span, WORDS_PER_POLY);

  // |prod| needs to be reduced mod (𝑥^n - 1), which just involves adding the
  // upper-half to the lower-half. However, N is 701, which isn't a multiple of
  // BITS_PER_WORD, so the upper-half vectors all have to be shifted before
  // being added to the lower-half.
  for (size_t i = 0; i < WORDS_PER_POLY; i++) {
    crypto_word_t v_s = prod_s[WORDS_PER_POLY + i - 1] >> BITS_IN_LAST_WORD;
    v_s |= prod_s[WORDS_PER_POLY + i] << (BITS_PER_WORD - BITS_IN_LAST_WORD);
    crypto_word_t v_a = prod_a[WORDS_PER_POLY + i - 1] >> BITS_IN_LAST_WORD;
    v_a |= prod_a[WORDS_PER_POLY + i] << (BITS_PER_WORD - BITS_IN_LAST_WORD);

    poly3_word_add(&out->s.v[i], &out->a.v[i], prod_s[i], prod_a[i], v_s, v_a);
  }

  poly3_mod_phiN(out);
}